

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

RecyclerWeakReference<Js::DynamicObject> * __thiscall
Js::DynamicObject::CreateWeakReferenceToSelf(DynamicObject *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *this_00;
  RecyclerWeakReference<Js::DynamicObject> *pRVar4;
  DynamicObject *this_local;
  
  bVar2 = ThreadContext::IsOnStack(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x403,"(!ThreadContext::IsOnStack(this))",
                                "!ThreadContext::IsOnStack(this)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = RecyclableObject::GetRecycler(&this->super_RecyclableObject);
  pRVar4 = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicObject>(this_00,this);
  return pRVar4;
}

Assistant:

RecyclerWeakReference<DynamicObject>* DynamicObject::CreateWeakReferenceToSelf()
    {
        Assert(!ThreadContext::IsOnStack(this));
        return GetRecycler()->CreateWeakReferenceHandle(this);
    }